

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteString(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,Ch *str,SizeType length)

{
  bool bVar1;
  byte bVar2;
  undefined1 local_38 [7];
  Ch c;
  GenericStringStream<rapidjson::UTF8<char>_> is;
  SizeType length_local;
  Ch *str_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  is.head_._4_4_ = length;
  PutReserve<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,(ulong)(length * 6 + 2));
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'\"');
  GenericStringStream<rapidjson::UTF8<char>_>::GenericStringStream
            ((GenericStringStream<rapidjson::UTF8<char>_> *)local_38,str);
  do {
    while( true ) {
      bVar1 = ScanWriteUnescapedString
                        (this,(GenericStringStream<rapidjson::UTF8<char>_> *)local_38,
                         (ulong)is.head_._4_4_);
      if (!bVar1) {
        PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'\"');
        return true;
      }
      bVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek
                        ((GenericStringStream<rapidjson::UTF8<char>_> *)local_38);
      if ("uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar2] == '\0') break;
      GenericStringStream<rapidjson::UTF8<char>_>::Take
                ((GenericStringStream<rapidjson::UTF8<char>_> *)local_38);
      PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'\\');
      PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                (this->os_,"uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar2]);
      if ("uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar2] == 'u') {
        PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'0');
        PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'0');
        PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                  (this->os_,"0123456789ABCDEF"[(int)(uint)bVar2 >> 4]);
        PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                  (this->os_,"0123456789ABCDEF"[(int)(bVar2 & 0xf)]);
      }
    }
    bVar1 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
            TranscodeUnsafe<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
                      ((GenericStringStream<rapidjson::UTF8<char>_> *)local_38,this->os_);
  } while (((bVar1 ^ 0xffU) & 1) == 0);
  return false;
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const typename TargetEncoding::Ch hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        if (TargetEncoding::supportUnicode)
            PutReserve(*os_, 2 + length * 6); // "\uxxxx..."
        else
            PutReserve(*os_, 2 + length * 12);  // "\uxxxx\uyyyy..."

        PutUnsafe(*os_, '\"');
        GenericStringStream<SourceEncoding> is(str);
        while (ScanWriteUnescapedString(is, length)) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && static_cast<unsigned>(c) >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (RAPIDJSON_UNLIKELY(!SourceEncoding::Decode(is, &codepoint)))
                    return false;
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, 'u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    PutUnsafe(*os_, hexDigits[(codepoint >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    PutUnsafe(*os_, hexDigits[(lead >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead      ) & 15]);
                    PutUnsafe(*os_, '\\');
                    PutUnsafe(*os_, 'u');
                    PutUnsafe(*os_, hexDigits[(trail >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || static_cast<unsigned>(c) < 256) && RAPIDJSON_UNLIKELY(escape[static_cast<unsigned char>(c)]))  {
                is.Take();
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, static_cast<typename TargetEncoding::Ch>(escape[static_cast<unsigned char>(c)]));
                if (escape[static_cast<unsigned char>(c)] == 'u') {
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) >> 4]);
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) & 0xF]);
                }
            }
            else if (RAPIDJSON_UNLIKELY(!(writeFlags & kWriteValidateEncodingFlag ? 
                Transcoder<SourceEncoding, TargetEncoding>::Validate(is, *os_) :
                Transcoder<SourceEncoding, TargetEncoding>::TranscodeUnsafe(is, *os_))))
                return false;
        }
        PutUnsafe(*os_, '\"');
        return true;
    }